

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O1

EdgeType raviX_get_edge_type(Graph *g,nodeId_t from,nodeId_t to)

{
  GraphNode *pGVar1;
  ulong uVar2;
  GraphNodeLink *pGVar3;
  ulong uVar4;
  
  if ((g->allocated <= from) || (pGVar1 = g->nodes[from], pGVar1 == (GraphNode *)0x0)) {
    pGVar1 = (GraphNode *)0x0;
  }
  if (pGVar1 != (GraphNode *)0x0) {
    uVar2 = 0xffffffffffffffff;
    if ((ulong)*(ushort *)&pGVar1->succs != 0) {
      uVar4 = 0;
      do {
        uVar2 = uVar4;
        if ((pGVar1->succs).links[uVar4].node_index == to) break;
        uVar4 = uVar4 + 1;
        uVar2 = 0xffffffffffffffff;
      } while (*(ushort *)&pGVar1->succs != uVar4);
    }
    if ((long)uVar2 < 0) {
      pGVar3 = (GraphNodeLink *)0x0;
    }
    else {
      pGVar3 = (pGVar1->succs).links + uVar2;
    }
    if (pGVar3 != (GraphNodeLink *)0x0) {
      return (EdgeType)pGVar3->edge_type;
    }
  }
  return EDGE_TYPE_UNCLASSIFIED;
}

Assistant:

enum EdgeType raviX_get_edge_type(Graph *g, nodeId_t from, nodeId_t to)
{
	GraphNode *prednode = raviX_get_node(g, from);
	if (prednode == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	struct GraphNodeLink *node_link = node_list_get(&prednode->succs, to);
	if (node_link == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	return (enum EdgeType) node_link->edge_type;
}